

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O0

Flags * __thiscall pstack::Flags::done(Flags *this)

{
  bool bVar1;
  value_type local_50;
  reference local_30;
  option *opt;
  iterator __end1;
  iterator __begin1;
  vector<option,_std::allocator<option>_> *__range1;
  Flags *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x48),"");
  __end1 = std::vector<option,_std::allocator<option>_>::begin
                     ((vector<option,_std::allocator<option>_> *)this);
  opt = (option *)
        std::vector<option,_std::allocator<option>_>::end
                  ((vector<option,_std::allocator<option>_> *)this);
  while (bVar1 = __gnu_cxx::operator==<option_*,_std::vector<option,_std::allocator<option>_>_>
                           (&__end1,(__normal_iterator<option_*,_std::vector<option,_std::allocator<option>_>_>
                                     *)&opt), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_30 = __gnu_cxx::__normal_iterator<option_*,_std::vector<option,_std::allocator<option>_>_>
               ::operator*(&__end1);
    if ((0 < local_30->val) &&
       (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this + 0x48),(char)local_30->val), local_30->has_arg != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x48),
                 ':');
    }
    __gnu_cxx::__normal_iterator<option_*,_std::vector<option,_std::allocator<option>_>_>::
    operator++(&__end1);
  }
  memset(&local_50,0,0x20);
  std::vector<option,_std::allocator<option>_>::push_back
            ((vector<option,_std::allocator<option>_> *)this,&local_50);
  return this;
}

Assistant:

const Flags &
Flags::done()
{
    shortOptions = "";
    for (auto &opt : longOptions) {
        if (opt.val > 0) {
           shortOptions += char(opt.val);
           if (opt.has_arg != 0)
               shortOptions += ':';
        }
    }
    longOptions.push_back({nullptr, 0, nullptr, 0});
    return *this;
}